

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthash.cpp
# Opt level: O2

uint64_t fasthash64(void *buf,size_t len,uint64_t seed)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = len >> 3;
  uVar2 = len * -0x77fcaa0de192e69b ^ seed;
  for (uVar4 = 0; (len & 0xfffffffffffffff8) != uVar4; uVar4 = uVar4 + 8) {
    uVar1 = (*(ulong *)((long)buf + uVar4) >> 0x17 ^ *(ulong *)((long)buf + uVar4)) *
            0x2127599bf4325c37;
    uVar2 = (uVar1 >> 0x2f ^ uVar2 ^ uVar1) * -0x77fcaa0de192e69b;
  }
  uVar4 = 0;
  switch((uint)len & 7) {
  case 7:
    uVar4 = (ulong)*(byte *)((long)buf + uVar3 * 8 + 6) << 0x30;
  case 6:
    uVar4 = uVar4 | (ulong)*(byte *)((long)buf + uVar3 * 8 + 5) << 0x28;
  case 5:
    uVar4 = uVar4 ^ (ulong)*(byte *)((long)buf + uVar3 * 8 + 4) << 0x20;
  case 4:
    uVar4 = uVar4 ^ (ulong)*(byte *)((long)buf + uVar3 * 8 + 3) << 0x18;
  case 3:
    uVar4 = uVar4 ^ (ulong)*(byte *)((long)buf + uVar3 * 8 + 2) << 0x10;
  case 2:
    uVar4 = uVar4 ^ (ulong)*(byte *)((long)buf + uVar3 * 8 + 1) << 8;
  case 1:
    uVar3 = (uVar4 >> 0x17 ^ uVar4 ^ (ulong)*(byte *)((long)buf + uVar3 * 8)) * 0x2127599bf4325c37;
    uVar2 = (uVar3 >> 0x2f ^ uVar2 ^ uVar3) * -0x77fcaa0de192e69b;
  case 0:
    uVar2 = (uVar2 >> 0x17 ^ uVar2) * 0x2127599bf4325c37;
    return uVar2 >> 0x2f ^ uVar2;
  }
}

Assistant:

uint64_t fasthash64(const void *buf, size_t len, uint64_t seed)
{
	const uint64_t    m = 0x880355f21e6d1965ULL;
	const uint64_t *pos = (const uint64_t *)buf;
	const uint64_t *end = pos + (len / 8);
	const unsigned char *pos2;
	uint64_t h = seed ^ (len * m);
	uint64_t v;

	while (pos != end) {
		v  = *pos++;
		h ^= mix(v);
		h *= m;
	}

	pos2 = (const unsigned char*)pos;
	v = 0;

	switch (len & 7) {
	case 7: v ^= (uint64_t)pos2[6] << 48;
	case 6: v ^= (uint64_t)pos2[5] << 40;
	case 5: v ^= (uint64_t)pos2[4] << 32;
	case 4: v ^= (uint64_t)pos2[3] << 24;
	case 3: v ^= (uint64_t)pos2[2] << 16;
	case 2: v ^= (uint64_t)pos2[1] << 8;
	case 1: v ^= (uint64_t)pos2[0];
		h ^= mix(v);
		h *= m;
	}

	return mix(h);
}